

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O2

void __thiscall unit_test::main(unit_test *this,string *path)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  request local_50 [32];
  
  bVar1 = std::operator==(path,"/status");
  if (bVar1) {
    iVar2 = cppcms::application::response();
    cppcms::http::response::status(iVar2);
  }
  bVar1 = std::operator==(path,"/chunks");
  uVar3 = cppcms::application::response();
  if (bVar1) {
    cppcms::http::response::io_mode(uVar3,0);
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    poVar4 = std::operator<<(poVar4,"path=");
    poVar4 = std::operator<<(poVar4,(string *)path);
    std::operator<<(poVar4,'\n');
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
  }
  else {
    poVar4 = (ostream *)cppcms::http::response::out();
    poVar4 = std::operator<<(poVar4,"path=");
    poVar4 = std::operator<<(poVar4,(string *)path);
    std::operator<<(poVar4,'\n');
  }
  cppcms::application::response();
  poVar4 = (ostream *)cppcms::http::response::out();
  poVar4 = std::operator<<(poVar4,"method=");
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_(local_50);
  poVar4 = std::operator<<(poVar4,(string *)local_50);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)local_50);
  if (bVar1) {
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
  }
  cppcms::application::request();
  lVar5 = cppcms::http::request::post_abi_cxx11_();
  p_Var6 = *(_Rb_tree_node_base **)(lVar5 + 0x18);
  cppcms::application::request();
  lVar5 = cppcms::http::request::post_abi_cxx11_();
  for (; p_Var6 != (_Rb_tree_node_base *)(lVar5 + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    cppcms::application::response();
    poVar4 = (ostream *)cppcms::http::response::out();
    poVar4 = std::operator<<(poVar4,(string *)(p_Var6 + 1));
    poVar4 = std::operator<<(poVar4,"=");
    poVar4 = std::operator<<(poVar4,(string *)(p_Var6 + 2));
    std::operator<<(poVar4,'\n');
    if (bVar1) {
      cppcms::application::response();
      cppcms::http::response::out();
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

virtual void main(std::string path)
	{
		bool flush=false;

		if(path=="/status")
			response().status(201);
		if(path=="/chunks")
			flush=true;

		if(flush)
			response().io_mode(cppcms::http::response::normal);
		response().out()<< "path=" << path << '\n' ;
		if(flush)
			response().out() << std::flush;

		response().out()<< "method=" << request().request_method() << '\n';
		if(flush)
			response().out() << std::flush;
		for(cppcms::http::request::form_type::const_iterator p=request().post().begin(),e=request().post().end();p!=e;++p){
			response().out() << p->first <<"=" << p->second << '\n';
			if(flush)
				response().out() << std::flush;
		}
	}